

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  char *pcVar14;
  REF_NODE pRVar15;
  int iVar16;
  REF_INTERP pRVar17;
  double dVar18;
  REF_INT nnode;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL quality0;
  REF_DBL original [3];
  REF_DBL ideal [3];
  REF_DBL quality;
  int local_28c;
  REF_INTERP local_288;
  REF_NODE local_280;
  long local_278;
  double local_270;
  double local_268;
  double local_260;
  long local_258;
  double local_250;
  REF_DBL local_248 [4];
  double local_228;
  undefined8 uStack_220;
  REF_DBL local_218 [4];
  double local_1f8;
  undefined8 uStack_1f0;
  REF_DBL local_1e8 [4];
  double local_1c8 [51];
  
  pRVar15 = ref_grid->node;
  pRVar17 = ref_grid->interp;
  if ((node < 0) ||
     ((((((pRVar1 = ref_grid->cell[3]->ref_adj, pRVar1->nnode <= node ||
          (pRVar1->first[(uint)node] == -1)) &&
         ((pRVar1 = ref_grid->cell[6]->ref_adj, pRVar1->nnode <= node ||
          (pRVar1->first[(uint)node] == -1)))) &&
        ((pRVar1 = ref_grid->cell[9]->ref_adj, pRVar1->nnode <= node ||
         (pRVar1->first[(uint)node] == -1)))) &&
       ((pRVar1 = ref_grid->cell[10]->ref_adj, pRVar1->nnode <= node ||
        (pRVar1->first[(uint)node] == -1)))) &&
      ((pRVar1 = ref_grid->cell[0xb]->ref_adj, pRVar1->nnode <= node ||
       (pRVar1->first[(uint)node] == -1)))))) {
    lVar13 = (long)(node * 0xf);
    local_248[2] = pRVar15->real[lVar13 + 2];
    pRVar2 = pRVar15->real + lVar13;
    local_248[0] = *pRVar2;
    local_248[1] = pRVar2[1];
    iVar7 = -1;
    if ((pRVar17 != (REF_INTERP)0x0) && (pRVar17->continuously != 0)) {
      iVar7 = pRVar17->cell[node];
    }
    uVar8 = ref_smooth_tet_quality_around(ref_grid,node,&local_250);
    if (uVar8 == 0) {
      uVar8 = ref_smooth_tet_ratio_around(ref_grid,node,&local_268,&local_270);
      if (uVar8 == 0) {
        lVar13 = lVar13 << 3;
        local_228 = local_250;
        uStack_220 = 0;
        bVar3 = local_268 <= 0.5;
        bVar4 = 2.0 <= local_270;
        local_278 = lVar13;
        if (bVar4 || (bVar3 || local_250 <= 0.5)) {
          uVar8 = ref_smooth_tet_weighted_ideal(ref_grid,node,local_1e8);
          if (uVar8 == 0) goto LAB_001f36ab;
          pcVar14 = "ideal";
          uVar12 = 0x5c2;
        }
        else {
          ref_node = ref_grid->node;
          uVar8 = ref_cell_node_list_around
                            (ref_grid->cell[8],node,100,&local_28c,(REF_INT *)local_1c8);
          if (uVar8 == 0) {
            local_218[0] = 0.0;
            local_218[1] = 0.0;
            local_218[2] = 0.0;
            local_288 = pRVar17;
            local_280 = pRVar15;
            if (0 < local_28c) {
              lVar13 = 0;
              do {
                uVar8 = ref_smooth_add_pliant_force
                                  (ref_node,node,*(REF_INT *)((long)local_1c8 + lVar13 * 4),
                                   local_218);
                if (uVar8 != 0) {
                  pcVar14 = "edge";
                  uVar12 = 0x58f;
                  goto LAB_001f3591;
                }
                lVar13 = lVar13 + 1;
              } while (lVar13 < local_28c);
            }
            pRVar2 = ref_node->real;
            dVar18 = ref_grid->adapt->smooth_pliant_alpha;
            lVar11 = 0;
            do {
              local_1e8[lVar11] =
                   local_218[lVar11] * dVar18 + *(double *)((long)pRVar2 + lVar11 * 8 + local_278);
              lVar11 = lVar11 + 1;
              lVar13 = local_278;
              pRVar15 = local_280;
              pRVar17 = local_288;
            } while (lVar11 != 3);
LAB_001f36ab:
            local_1f8 = local_228 * 0.9;
            uStack_1f0 = 0;
            local_258 = (long)node;
            dVar18 = 1.0;
            uVar8 = 0;
            iVar16 = 0;
            local_288 = pRVar17;
            local_280 = pRVar15;
            do {
              pRVar2 = local_280->real;
              lVar11 = 0;
              do {
                *(double *)((long)pRVar2 + lVar11 * 8 + lVar13) =
                     local_1e8[lVar11] * dVar18 + local_248[lVar11] * (1.0 - dVar18);
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              local_260 = dVar18;
              uVar9 = ref_metric_interpolate_node(ref_grid,node);
              if ((uVar9 != 0) && (uVar9 != 5)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x5ca,"ref_smooth_tet_improve",(ulong)uVar9,
                       "ref_metric_interpolate_node failed");
                uVar8 = uVar9;
              }
              if ((uVar9 != 5) && (uVar9 != 0)) {
                return uVar8;
              }
              uVar10 = ref_smooth_tet_quality_around(ref_grid,node,local_1c8);
              if (uVar10 != 0) {
                pcVar14 = "q";
                uVar12 = 0x5cb;
LAB_001f393f:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,uVar12,"ref_smooth_tet_improve",(ulong)uVar10,pcVar14);
                return uVar10;
              }
              uVar10 = ref_smooth_tet_ratio_around(ref_grid,node,&local_268,&local_270);
              if (uVar10 != 0) {
                pcVar14 = "ratio";
                uVar12 = 0x5cd;
                goto LAB_001f393f;
              }
              if (uVar9 == 0) {
                if (ref_grid->adapt->post_min_ratio <= local_268) {
                  bVar6 = local_270 <= ref_grid->adapt->post_max_ratio;
                }
                else {
                  bVar6 = false;
                }
              }
              else {
                bVar6 = false;
              }
              if (bVar4 || (bVar3 || local_250 <= 0.5)) {
                bVar5 = local_228 < local_1c8[0];
              }
              else {
                bVar5 = local_1f8 < local_1c8[0] && 0.4 < local_1c8[0];
              }
              if ((bool)(bVar6 & bVar5)) goto LAB_001f3412;
              dVar18 = local_260 * 0.5;
              if (uVar9 != 0 && iVar7 != -1) {
                local_288->cell[local_258] = iVar7;
              }
              iVar16 = iVar16 + 1;
              lVar13 = local_278;
            } while (iVar16 != 8);
            pRVar2 = local_280->real;
            *(REF_DBL *)((long)pRVar2 + local_278 + 0x10) = local_248[2];
            pRVar2 = (REF_DBL *)((long)pRVar2 + local_278);
            *pRVar2 = local_248[0];
            pRVar2[1] = local_248[1];
            uVar9 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar9 != 0) && (uVar9 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x5e1,"ref_smooth_tet_improve",(ulong)uVar9,"interp");
              uVar8 = uVar9;
            }
            if ((uVar9 != 5) && (uVar9 != 0)) {
              return uVar8;
            }
            goto LAB_001f3412;
          }
          pcVar14 = "node list for pliant tet edges";
          uVar12 = 0x589;
LAB_001f3591:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 uVar12,"ref_smooth_tet_pliant",(ulong)uVar8,pcVar14);
          pcVar14 = "pliant";
          uVar12 = 0x5c0;
        }
      }
      else {
        pcVar14 = "ratio";
        uVar12 = 0x5bc;
      }
    }
    else {
      pcVar14 = "q";
      uVar12 = 0x5ba;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar12
           ,"ref_smooth_tet_improve",(ulong)uVar8,pcVar14);
  }
  else {
LAB_001f3412:
    uVar8 = 0;
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_improve(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, quality0, quality, min_ratio, max_ratio;
  REF_INT ixyz;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing;
  REF_BOOL accept;

  /* can't handle boundaries yet */
  if (!ref_cell_node_empty(ref_grid_tri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_qua(ref_grid), node))
    return REF_SUCCESS;

  /* can't mixed elements */
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_pri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_hex(ref_grid), node))
    return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality0), "q");
  RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (quality0 > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);

  if (pliant_smoothing) {
    RSS(ref_smooth_tet_pliant(ref_grid, node, ideal), "pliant");
  } else {
    RSS(ref_smooth_tet_weighted_ideal(ref_grid, node, ideal), "ideal");
  }
  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    RSS(ref_smooth_tet_quality_around(ref_grid, node, &quality), "q");
    RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
        "ratio");
    accept = (REF_SUCCESS == interp_status);
    accept = accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
    accept = accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));
    if (pliant_smoothing) {
      accept = accept && (quality > 0.9 * quality0);
      accept = accept && (quality > 0.4);
    } else {
      accept = accept && (quality > quality0);
    }
    if (accept) {
      return REF_SUCCESS;
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}